

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostics.cpp
# Opt level: O3

void __thiscall Diagnostics::validateNetwork(Diagnostics *this,Network *nw)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  pointer ppNVar6;
  NetworkError *pNVar7;
  InputError *this_00;
  string local_88;
  string local_68;
  string local_48;
  
  iVar5 = Network::count(nw,NODE);
  if (iVar5 < 2) {
    pNVar7 = (NetworkError *)__cxa_allocate_exception(0x30);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
    NetworkError::NetworkError(pNVar7,1,&local_88);
    __cxa_throw(pNVar7,&NetworkError::typeinfo,ENerror::~ENerror);
  }
  ppNVar6 = (nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppNVar6 ==
        (nw->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pNVar7 = (NetworkError *)__cxa_allocate_exception(0x30);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
      NetworkError::NetworkError(pNVar7,2,&local_68);
      __cxa_throw(pNVar7,&NetworkError::typeinfo,ENerror::~ENerror);
    }
    if ((*ppNVar6)->fixedGrade != false) break;
    ppNVar6 = ppNVar6 + 1;
  }
  bVar1 = hasValidNodes(nw);
  bVar2 = hasValidLinks(nw);
  bVar3 = hasValidValves(nw);
  bVar4 = hasConnectedNodes(nw);
  if ((((bVar4) && (bVar3)) && (bVar1)) && (bVar2)) {
    return;
  }
  this_00 = (InputError *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48);
  InputError::InputError(this_00,0,&local_48);
  __cxa_throw(this_00,&InputError::typeinfo,ENerror::~ENerror);
}

Assistant:

void Diagnostics::validateNetwork(Network* nw)
{
    bool result = true;
    if ( nw->count(Element::NODE) < 2 )
    {
        throw NetworkError(NetworkError::TOO_FEW_NODES, "");
    }
    if ( !hasFixedGradeNodes(nw) )
    {
         throw NetworkError(NetworkError::NO_FIXED_GRADE_NODES, "");
    }
    if ( !hasValidNodes(nw) )      result = false;
    if ( !hasValidLinks(nw) )      result = false;
    if ( !hasValidValves(nw) )     result = false;
    if ( !hasValidCurves(nw) )     result = false;
    if ( !hasConnectedNodes(nw) )  result = false;
    if ( result == false )
    {
        throw InputError(InputError::ERRORS_IN_INPUT_DATA, "");
    }
}